

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000270150 = 0x2d2d2d2d2d2d2d;
    uRam0000000000270157._0_1_ = '-';
    uRam0000000000270157._1_1_ = '-';
    uRam0000000000270157._2_1_ = '-';
    uRam0000000000270157._3_1_ = '-';
    uRam0000000000270157._4_1_ = '-';
    uRam0000000000270157._5_1_ = '-';
    uRam0000000000270157._6_1_ = '-';
    uRam0000000000270157._7_1_ = '-';
    DAT_00270140 = '-';
    DAT_00270140_1._0_1_ = '-';
    DAT_00270140_1._1_1_ = '-';
    DAT_00270140_1._2_1_ = '-';
    DAT_00270140_1._3_1_ = '-';
    DAT_00270140_1._4_1_ = '-';
    DAT_00270140_1._5_1_ = '-';
    DAT_00270140_1._6_1_ = '-';
    uRam0000000000270148 = 0x2d2d2d2d2d2d2d;
    DAT_0027014f = 0x2d;
    DAT_00270130 = '-';
    DAT_00270130_1._0_1_ = '-';
    DAT_00270130_1._1_1_ = '-';
    DAT_00270130_1._2_1_ = '-';
    DAT_00270130_1._3_1_ = '-';
    DAT_00270130_1._4_1_ = '-';
    DAT_00270130_1._5_1_ = '-';
    DAT_00270130_1._6_1_ = '-';
    uRam0000000000270138._0_1_ = '-';
    uRam0000000000270138._1_1_ = '-';
    uRam0000000000270138._2_1_ = '-';
    uRam0000000000270138._3_1_ = '-';
    uRam0000000000270138._4_1_ = '-';
    uRam0000000000270138._5_1_ = '-';
    uRam0000000000270138._6_1_ = '-';
    uRam0000000000270138._7_1_ = '-';
    DAT_00270120 = '-';
    DAT_00270120_1._0_1_ = '-';
    DAT_00270120_1._1_1_ = '-';
    DAT_00270120_1._2_1_ = '-';
    DAT_00270120_1._3_1_ = '-';
    DAT_00270120_1._4_1_ = '-';
    DAT_00270120_1._5_1_ = '-';
    DAT_00270120_1._6_1_ = '-';
    uRam0000000000270128._0_1_ = '-';
    uRam0000000000270128._1_1_ = '-';
    uRam0000000000270128._2_1_ = '-';
    uRam0000000000270128._3_1_ = '-';
    uRam0000000000270128._4_1_ = '-';
    uRam0000000000270128._5_1_ = '-';
    uRam0000000000270128._6_1_ = '-';
    uRam0000000000270128._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000270118._0_1_ = '-';
    uRam0000000000270118._1_1_ = '-';
    uRam0000000000270118._2_1_ = '-';
    uRam0000000000270118._3_1_ = '-';
    uRam0000000000270118._4_1_ = '-';
    uRam0000000000270118._5_1_ = '-';
    uRam0000000000270118._6_1_ = '-';
    uRam0000000000270118._7_1_ = '-';
    DAT_0027015f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}